

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O3

void lj_debug_shortname(char *out,GCstr *str,BCLine line)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  GCstr *__src;
  ulong uVar4;
  size_t __n;
  
  cVar1 = (char)str[1].nextgc.gcptr32;
  if (cVar1 == '=') {
    strncpy(out,(char *)((long)&str[1].nextgc.gcptr32 + 1),0x3c);
    out[0x3b] = '\0';
    return;
  }
  if (cVar1 == '@') {
    uVar2 = str->len - 1;
    pcVar3 = (char *)((long)&str[1].nextgc.gcptr32 + 1);
    if (0x3b < uVar2) {
      pcVar3 = pcVar3 + ((ulong)uVar2 - 0x38);
      out[0] = '.';
      out[1] = '.';
      out[2] = '.';
      out = out + 3;
    }
  }
  else {
    __src = str + 1;
    uVar4 = 0;
    do {
      if (*(byte *)((long)&(__src->nextgc).gcptr32 + uVar4) < 0x20) goto LAB_00111e09;
      uVar4 = uVar4 + 1;
    } while (uVar4 != 0x30);
    uVar4 = 0x30;
LAB_00111e09:
    pcVar3 = "[string \"";
    if (line == -1) {
      pcVar3 = "[builtin:";
    }
    *(undefined2 *)(out + 8) = *(undefined2 *)(pcVar3 + 8);
    *(undefined8 *)out = *(undefined8 *)pcVar3;
    pcVar3 = out + 9;
    if (*(char *)((long)&(__src->nextgc).gcptr32 + uVar4) == '\0') {
      strcpy(pcVar3,(char *)__src);
      out = pcVar3 + uVar4;
    }
    else {
      __n = 0x2d;
      if (uVar4 < 0x2d) {
        __n = uVar4;
      }
      strncpy(pcVar3,(char *)__src,__n);
      builtin_strncpy(out + __n + 9,"...",4);
      out = pcVar3 + __n + 3;
    }
    pcVar3 = "\"]";
    if (line == -1) {
      pcVar3 = "]";
    }
  }
  strcpy(out,pcVar3);
  return;
}

Assistant:

void lj_debug_shortname(char *out, GCstr *str, BCLine line)
{
  const char *src = strdata(str);
  if (*src == '=') {
    strncpy(out, src+1, LUA_IDSIZE);  /* Remove first char. */
    out[LUA_IDSIZE-1] = '\0';  /* Ensures null termination. */
  } else if (*src == '@') {  /* Output "source", or "...source". */
    size_t len = str->len-1;
    src++;  /* Skip the `@' */
    if (len >= LUA_IDSIZE) {
      src += len-(LUA_IDSIZE-4);  /* Get last part of file name. */
      *out++ = '.'; *out++ = '.'; *out++ = '.';
    }
    strcpy(out, src);
  } else {  /* Output [string "string"] or [builtin:name]. */
    size_t len;  /* Length, up to first control char. */
    for (len = 0; len < LUA_IDSIZE-12; len++)
      if (((const unsigned char *)src)[len] < ' ') break;
    strcpy(out, line == ~(BCLine)0 ? "[builtin:" : "[string \""); out += 9;
    if (src[len] != '\0') {  /* Must truncate? */
      if (len > LUA_IDSIZE-15) len = LUA_IDSIZE-15;
      strncpy(out, src, len); out += len;
      strcpy(out, "..."); out += 3;
    } else {
      strcpy(out, src); out += len;
    }
    strcpy(out, line == ~(BCLine)0 ? "]" : "\"]");
  }
}